

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsSetContextData(JsContextRef context,void *data)

{
  bool bVar1;
  DebugCheckNoException local_28;
  DebugCheckNoException __debugCheckNoException;
  void *data_local;
  JsContextRef context_local;
  
  if (context == (JsContextRef)0x0) {
    context_local._4_4_ = JsErrorInvalidArgument;
  }
  else {
    __debugCheckNoException = (DebugCheckNoException)data;
    DebugCheckNoException::DebugCheckNoException(&local_28);
    bVar1 = JsrtContext::Is(context);
    if (bVar1) {
      JsrtContext::SetExternalData((JsrtContext *)context,(void *)__debugCheckNoException);
    }
    else {
      context_local._4_4_ = JsErrorInvalidArgument;
    }
    local_28.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_28);
    if (bVar1) {
      context_local._4_4_ = JsNoError;
    }
  }
  return context_local._4_4_;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsSetContextData(_In_ JsContextRef context, _In_ void *data)
{
    VALIDATE_JSREF(context);

    BEGIN_JSRT_NO_EXCEPTION
    {
        if (!JsrtContext::Is(context))
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }

        static_cast<JsrtContext *>(context)->SetExternalData(data);
    }